

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

OrphanBuilder *
capnp::_::OrphanBuilder::initStructList
          (OrphanBuilder *__return_storage_ptr__,BuilderArena *arena,CapTableBuilder *capTable,
          ElementCount elementCount,StructSize elementSize)

{
  WirePointer *ref;
  word *pwVar1;
  undefined1 local_58 [8];
  ListBuilder builder;
  ElementCount elementCount_local;
  CapTableBuilder *capTable_local;
  BuilderArena *arena_local;
  StructSize elementSize_local;
  OrphanBuilder *result;
  
  builder.structDataSize._3_1_ = 0;
  builder._36_4_ = elementCount;
  OrphanBuilder(__return_storage_ptr__);
  ref = tagAsPtr(__return_storage_ptr__);
  WireHelpers::initStructListPointer
            ((ListBuilder *)local_58,ref,(SegmentBuilder *)0x0,capTable,builder._36_4_,elementSize,
             arena);
  __return_storage_ptr__->segment = (SegmentBuilder *)local_58;
  __return_storage_ptr__->capTable = capTable;
  pwVar1 = ListBuilder::getLocation((ListBuilder *)local_58);
  __return_storage_ptr__->location = pwVar1;
  return __return_storage_ptr__;
}

Assistant:

OrphanBuilder OrphanBuilder::initStructList(
    BuilderArena* arena, CapTableBuilder* capTable,
    ElementCount elementCount, StructSize elementSize) {
  OrphanBuilder result;
  ListBuilder builder = WireHelpers::initStructListPointer(
      result.tagAsPtr(), nullptr, capTable, elementCount, elementSize, arena);
  result.segment = builder.segment;
  result.capTable = capTable;
  result.location = builder.getLocation();
  return result;
}